

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O1

void msd_D_adaptive<std::vector<unsigned_char*,std::allocator<unsigned_char*>>>
               (uchar **strings,size_t n,size_t depth,
               vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets)

{
  vector<unsigned_char*,std::allocator<unsigned_char*>> *pvVar1;
  uchar *puVar2;
  iterator iVar3;
  long lVar4;
  size_t n_00;
  size_t j;
  long *__ptr;
  long lVar5;
  pointer *pppuVar6;
  ushort uVar7;
  size_t __n;
  uchar **__args;
  uchar **ppuVar8;
  uint i;
  size_t j_1;
  long lVar9;
  ulong uVar10;
  uint16_t cache [16];
  ushort auStack_58 [20];
  
  if (n < 0x10000) {
    msd_D<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
              (strings,n,depth,buckets);
    return;
  }
  __ptr = (long *)malloc(0x80000);
  if ((n & 0xfffffffffffffff0) == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    ppuVar8 = strings;
    do {
      lVar5 = 0;
      do {
        puVar2 = ppuVar8[lVar5];
        if (puVar2 == (uchar *)0x0) goto LAB_00195742;
        if (puVar2[depth] == '\0') {
          uVar7 = 0;
        }
        else {
          uVar7 = CONCAT11(puVar2[depth],puVar2[depth + 1]);
        }
        auStack_58[lVar5] = uVar7;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      lVar5 = 0;
      __args = ppuVar8;
      do {
        pvVar1 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
                 (buckets + auStack_58[lVar5]);
        iVar3._M_current = *(uchar ***)(pvVar1 + 8);
        if (iVar3._M_current == *(uchar ***)(pvVar1 + 0x10)) {
          std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_realloc_insert<unsigned_char*const&>(pvVar1,iVar3,__args);
        }
        else {
          *iVar3._M_current = *__args;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
        lVar5 = lVar5 + 1;
        __args = __args + 1;
      } while (lVar5 != 0x10);
      uVar10 = uVar10 + 0x10;
      ppuVar8 = ppuVar8 + 0x10;
    } while (uVar10 < (n & 0xfffffffffffffff0));
  }
  lVar5 = n - uVar10;
  if (uVar10 <= n && lVar5 != 0) {
    ppuVar8 = strings + uVar10;
    do {
      puVar2 = *ppuVar8;
      if (puVar2 == (uchar *)0x0) {
LAB_00195742:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar2[depth] == '\0') {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)CONCAT11(puVar2[depth],puVar2[depth + 1]);
      }
      pvVar1 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)(buckets + uVar10);
      iVar3._M_current = *(uchar ***)(pvVar1 + 8);
      if (iVar3._M_current == *(uchar ***)(pvVar1 + 0x10)) {
        std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_realloc_insert<unsigned_char*const&>(pvVar1,iVar3,ppuVar8);
      }
      else {
        *iVar3._M_current = puVar2;
        *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
      }
      ppuVar8 = ppuVar8 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  pppuVar6 = &(buckets->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = 0;
  do {
    __ptr[lVar5] = (long)*pppuVar6 - (long)((_Vector_impl_data *)(pppuVar6 + -1))->_M_start >> 3;
    lVar5 = lVar5 + 1;
    pppuVar6 = pppuVar6 + 3;
  } while (lVar5 != 0x10000);
  pppuVar6 = &(buckets->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = 0;
  lVar9 = 0;
  do {
    lVar4 = __ptr[lVar5];
    if (lVar4 != 0) {
      __n = (long)*pppuVar6 - (long)((_Vector_impl_data *)(pppuVar6 + -1))->_M_start;
      if (__n != 0) {
        memmove(strings + lVar9,((_Vector_impl_data *)(pppuVar6 + -1))->_M_start,__n);
      }
      lVar9 = lVar9 + lVar4;
    }
    lVar5 = lVar5 + 1;
    pppuVar6 = pppuVar6 + 3;
  } while (lVar5 != 0x10000);
  lVar5 = 8;
  do {
    lVar9 = *(long *)((long)buckets + lVar5 + -8);
    if (*(long *)((long)&(buckets->
                         super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                         _M_impl.super__Vector_impl_data._M_start + lVar5) != lVar9) {
      *(long *)((long)&(buckets->
                       super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start + lVar5) = lVar9;
    }
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x180008);
  lVar5 = *__ptr;
  lVar9 = 1;
  do {
    n_00 = __ptr[lVar9];
    if (n_00 != 0) {
      if ((char)lVar9 != '\0') {
        msd_D_adaptive<std::vector<unsigned_char*,std::allocator<unsigned_char*>>>
                  (strings + lVar5,n_00,depth + 2,buckets);
      }
      lVar5 = lVar5 + n_00;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10000);
  free(__ptr);
  return;
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}